

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_print(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid,char *description)

{
  REF_DBL *pRVar1;
  double dVar2;
  REF_DBL log_mean;
  REF_INT sum;
  REF_INT i;
  char *description_local;
  REF_GRID ref_grid_local;
  REF_HISTOGRAM ref_histogram_local;
  
  log_mean._0_4_ = 0;
  for (log_mean._4_4_ = 0; log_mean._4_4_ < ref_histogram->nbin; log_mean._4_4_ = log_mean._4_4_ + 1
      ) {
    log_mean._0_4_ = ref_histogram->bins[log_mean._4_4_] + log_mean._0_4_;
  }
  printf("%7.3f %10.3e min %s\n",ref_histogram->min,ref_histogram->min,description);
  for (log_mean._4_4_ = 0; log_mean._4_4_ < ref_histogram->nbin; log_mean._4_4_ = log_mean._4_4_ + 1
      ) {
    dVar2 = pow(2.0,(1.0 / ref_histogram->exp) *
                    (double)((log_mean._4_4_ + 1) - ref_histogram->nbin / 2));
    if ((ref_histogram->min <= dVar2 && dVar2 != ref_histogram->min) &&
       (dVar2 = pow(2.0,(1.0 / ref_histogram->exp) *
                        (double)((log_mean._4_4_ + -1) - ref_histogram->nbin / 2)),
       dVar2 < ref_histogram->max)) {
      dVar2 = pow(2.0,(1.0 / ref_histogram->exp) *
                      (double)(log_mean._4_4_ - ref_histogram->nbin / 2));
      pRVar1 = &ref_grid->adapt->split_ratio;
      if (((dVar2 < *pRVar1 || dVar2 == *pRVar1) &&
          (dVar2 = pow(2.0,(1.0 / ref_histogram->exp) *
                           (double)((log_mean._4_4_ + -1) - ref_histogram->nbin / 2)),
          ref_grid->adapt->collapse_ratio <= dVar2)) || (ref_histogram->bins[log_mean._4_4_] < 1)) {
        pow(2.0,(1.0 / ref_histogram->exp) * (double)(log_mean._4_4_ - ref_histogram->nbin / 2));
        printf("%7.3f:%10d\n",(ulong)(uint)ref_histogram->bins[log_mean._4_4_]);
      }
      else {
        pow(2.0,(1.0 / ref_histogram->exp) * (double)(log_mean._4_4_ - ref_histogram->nbin / 2));
        printf("%7.3f:%10d *\n",(ulong)(uint)ref_histogram->bins[log_mean._4_4_]);
      }
    }
  }
  printf("%7.3f %10.3e:%10d max %s\n",ref_histogram->max,ref_histogram->max,(ulong)log_mean._0_4_,
         description);
  pow(2.0,ref_histogram->log_total / (double)(int)log_mean._0_4_);
  printf("%18.10f mean %s\n",description);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_print(REF_HISTOGRAM ref_histogram,
                                       REF_GRID ref_grid,
                                       const char *description) {
  REF_INT i, sum;
  REF_DBL log_mean;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);

  printf("%7.3f %10.3e min %s\n", ref_histogram_min(ref_histogram),
         ref_histogram_min(ref_histogram), description);

  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    if (ref_histogram_to_obs(i + 1) > ref_histogram_min(ref_histogram) &&
        ref_histogram_to_obs(i - 1) < ref_histogram_max(ref_histogram)) {
      if ((ref_histogram_to_obs(i) > ref_grid_adapt(ref_grid, split_ratio) ||
           ref_histogram_to_obs(i - 1) <
               ref_grid_adapt(ref_grid, collapse_ratio)) &&
          ref_histogram_bin(ref_histogram, i) > 0) {
        printf("%7.3f:%10d *\n", ref_histogram_to_obs(i),
               ref_histogram_bin(ref_histogram, i));
      } else {
        printf("%7.3f:%10d\n", ref_histogram_to_obs(i),
               ref_histogram_bin(ref_histogram, i));
      }
    }

  printf("%7.3f %10.3e:%10d max %s\n", ref_histogram_max(ref_histogram),
         ref_histogram_max(ref_histogram), sum, description);
  log_mean = ref_histogram_log_total(ref_histogram) / (REF_DBL)sum;
  printf("%18.10f mean %s\n", pow(2.0, log_mean), description);

  return REF_SUCCESS;
}